

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

Array<unsigned_long> * __thiscall
capnp::Schema::getGenericScopeIds(Array<unsigned_long> *__return_storage_ptr__,Schema *this)

{
  unsigned_long *puVar1;
  size_t sVar2;
  RawBrandedSchema *pRVar3;
  long lVar4;
  size_t sVar5;
  Reader RStack_48;
  
  getProto(&RStack_48,this);
  if ((RStack_48._reader.dataSize < 0x121) ||
     ((*(byte *)((long)RStack_48._reader.data + 0x24) & 1) == 0)) {
    __return_storage_ptr__->ptr = (unsigned_long *)0x0;
    __return_storage_ptr__->size_ = 0;
    __return_storage_ptr__->disposer = (ArrayDisposer *)0x0;
  }
  else {
    kj::heapArray<unsigned_long>(__return_storage_ptr__,(ulong)this->raw->scopeCount);
    puVar1 = __return_storage_ptr__->ptr;
    sVar2 = __return_storage_ptr__->size_;
    pRVar3 = this->raw;
    lVar4 = 0;
    for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
      puVar1[sVar5] = *(unsigned_long *)((long)&pRVar3->scopes->typeId + lVar4);
      lVar4 = lVar4 + 0x18;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<uint64_t> Schema::getGenericScopeIds() const {
  if (!getProto().getIsGeneric())
    return nullptr;

  auto result = kj::heapArray<uint64_t>(raw->scopeCount);
  for (auto iScope: kj::indices(result)) {
    result[iScope] = raw->scopes[iScope].typeId;
  }

  return result;
}